

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O3

void __thiscall
UIContext::Detail::Detail
          (Detail *this,GraphicsContext *context,function<void_(ApplicationContextBase_&)> *run,
          string *window_name,int width,int height)

{
  pointer pcVar1;
  long lVar2;
  GLFWwindow *handle;
  ImGuiContext *pIVar3;
  
  this->_window = (GLFWwindow *)0x0;
  this->_context = (ImGuiContext *)0x0;
  (this->_window_name)._M_dataplus._M_p = (pointer)&(this->_window_name).field_2;
  pcVar1 = (window_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_window_name,pcVar1,pcVar1 + window_name->_M_string_length);
  std::function<void_(ApplicationContextBase_&)>::function(&this->_run,run);
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,3);
  glfwWindowHint(0x20004,1);
  lVar2 = __dynamic_cast(context,&GraphicsContext::typeinfo,&GLFWGraphicsContext::typeinfo);
  handle = glfwCreateWindow(width,height,(window_name->_M_dataplus)._M_p,(GLFWmonitor *)0x0,
                            *(GLFWwindow **)(lVar2 + 8));
  this->_window = handle;
  glfwMakeContextCurrent(handle);
  ImGui::DebugCheckVersionAndDataLayout("1.68 WIP",0x1548,0x3a0,8,0x10,0x14);
  pIVar3 = ImGui::CreateContext((ImFontAtlas *)0x0);
  this->_context = pIVar3;
  ImGui::GetIO();
  ImGui::StyleColorsDark((ImGuiStyle *)0x0);
  ImGui_ImplGlfw_InitForOpenGL(this->_window,true);
  ImGui_ImplOpenGL3_Init("#version 150");
  glfwMakeContextCurrent((GLFWwindow *)0x0);
  return;
}

Assistant:

Detail(GraphicsContext& context,
           std::function<void(ApplicationContextBase&)> run,
           const std::string& window_name, int width, int height)
        : _window_name(window_name), _run(run)
    {
        setGlfwFlags();
        glfwWindowHint(GLFW_VISIBLE, GLFW_TRUE);

        GLFWGraphicsContext* gc = dynamic_cast<GLFWGraphicsContext*>(&context);

        _window = glfwCreateWindow(width, height, window_name.c_str(), NULL, gc->_window);
        glfwMakeContextCurrent(_window);

        // Setup Dear ImGui context
        IMGUI_CHECKVERSION();
        _context = ImGui::CreateContext();
        ImGuiIO& io = ImGui::GetIO(); (void)io;
        //io.ConfigFlags |= ImGuiConfigFlags_NavEnableKeyboard;  // Enable Keyboard Controls
        //io.ConfigFlags |= ImGuiConfigFlags_NavEnableGamepad;   // Enable Gamepad Controls

        // Setup Dear ImGui style
        ImGui::StyleColorsDark();
        //ImGui::StyleColorsClassic();

        // Setup Platform/Renderer bindings
        const char* glsl_version = "#version 150";
        ImGui_ImplGlfw_InitForOpenGL(_window, true);
        ImGui_ImplOpenGL3_Init(glsl_version);
    
        // the context should only be captured when it's in use, as it can't be
        // captured in two places at once
        glfwMakeContextCurrent(nullptr);
    }